

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputIterator.hpp
# Opt level: O2

KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_> __thiscall
supermap::io::
InputIterator<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_>,_char,_6UL,_void>::
next(InputIterator<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_>,_char,_6UL,_void>
     *this)

{
  istream *is;
  undefined8 *in_RSI;
  KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_> KVar1;
  
  *(char *)(in_RSI + 1) = *(char *)(in_RSI + 1) + '\x01';
  is = (istream *)(*(code *)**(undefined8 **)*in_RSI)();
  KVar1 = DeserializeHelper<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_>,_void>
          ::deserialize((DeserializeHelper<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_>,_void>
                         *)this,is);
  KVar1._0_8_ = this;
  return KVar1;
}

Assistant:

T next() {
        ++index_;
        return deserialize<T>(input_->get());
    }